

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Graph<std::pair<double,_double>_>::tarjan
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,Graph<std::pair<double,_double>_> *this,int id_src)

{
  pointer ppVVar1;
  Vertex<std::pair<double,_double>_> *pVVar2;
  pointer ppVVar3;
  vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  *__range1;
  int index;
  stack<Vertex<std::pair<double,_double>_>_*,_std::deque<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
  st;
  int local_8c;
  _Deque_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  local_88;
  
  ppVVar1 = (this->vertexSet).
            super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVVar3 = (this->vertexSet).
                 super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVVar3 != ppVVar1;
      ppVVar3 = ppVVar3 + 1) {
    pVVar2 = *ppVVar3;
    pVVar2->index = -1;
    pVVar2->low = -1;
    pVVar2->onStack = false;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8c = 0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  ::_M_initialize_map(&local_88,0);
  ppVVar3 = (this->vertexSet).
            super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (this->vertexSet).
            super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar3 != ppVVar1) {
    do {
      if ((*ppVVar3)->index == -1) {
        strongconnect(this,*ppVVar3,&local_8c,
                      (stack<Vertex<std::pair<double,_double>_>_*,_std::deque<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>_>
                       *)&local_88,__return_storage_ptr__);
      }
      ppVVar3 = ppVVar3 + 1;
    } while (ppVVar3 != ppVVar1);
  }
  std::
  _Deque_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  ::~_Deque_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

vector<vector<int>> Graph<T>::tarjan(const int id_src) {
    for (Vertex<T>* vertex : vertexSet) {
        vertex->index = -1;
        vertex->low = -1;
        vertex->onStack = false;
    }

    vector<vector<int>> scc;

    int index = 0;
    stack<Vertex<T>*> st;

    for (Vertex<T>* vertex : vertexSet) {
        if (vertex->index == -1) {
            strongconnect(vertex, index, st, scc);
        }
    }

    return scc;
}